

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::CheckOpcode1(TypeChecker *this,Opcode opcode)

{
  Type TVar1;
  Result RVar2;
  char *desc;
  Opcode local_1c;
  
  local_1c.enum_ = opcode.enum_;
  TVar1 = Opcode::GetParamType1(&local_1c);
  desc = Opcode::GetName(&local_1c);
  RVar2 = PopAndCheck1Type(this,TVar1,desc);
  TVar1 = Opcode::GetResultType(&local_1c);
  PushType(this,TVar1);
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode1(Opcode opcode) {
  Result result = PopAndCheck1Type(opcode.GetParamType1(), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}